

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

TextureLevel *
vkt::image::anon_unknown_0::generateReferenceImage
          (TextureLevel *__return_storage_ptr__,IVec3 *imageSize,VkFormat imageFormat,
          VkFormat readFormat)

{
  uint uVar1;
  undefined4 uVar2;
  bool bVar3;
  int i_1;
  int iVar4;
  int z;
  ChannelOrder CVar5;
  VkFormat format;
  int y_1;
  ChannelOrder z_00;
  int x;
  ChannelOrder x_00;
  int y_00;
  ulong uVar6;
  long lVar7;
  int x_1;
  ChannelOrder CVar8;
  int iVar9;
  int y;
  ChannelOrder y_01;
  bool bVar10;
  bool bVar11;
  IVec4 color;
  Vec4 newColor;
  PixelBufferAccess access;
  undefined1 local_128 [24];
  Vec4 local_110;
  ulong local_100;
  IVec3 *local_f8;
  ChannelOrder local_f0;
  int local_ec;
  float local_e8;
  float local_e4;
  TextureLevel *local_e0;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  PixelBufferAccess local_b8;
  PixelBufferAccess local_90;
  PixelBufferAccess local_68;
  Vector<int,_3> local_3c;
  
  local_90.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(imageFormat);
  tcu::TextureLevel::TextureLevel
            (__return_storage_ptr__,(TextureFormat *)&local_90,imageSize->m_data[0],
             imageSize->m_data[1],imageSize->m_data[2]);
  local_e0 = __return_storage_ptr__;
  tcu::TextureLevel::getAccess(&local_90,__return_storage_ptr__);
  tcu::Vector<int,_3>::Vector(&local_3c,imageSize);
  local_e4 = computeStoreColorScale(imageFormat,&local_3c);
  local_e8 = computeStoreColorBias(imageFormat);
  local_128._16_4_ = imageFormat;
  local_128._20_4_ = readFormat;
  bVar3 = isIntegerFormat(imageFormat);
  local_100 = CONCAT71(local_100._1_7_,bVar3);
  iVar4 = imageSize->m_data[0];
  iVar9 = imageSize->m_data[1];
  local_f0 = iVar4 - A;
  local_f8 = imageSize;
  local_ec = iVar9;
  for (z_00 = R; format = local_128._20_4_, (int)z_00 < imageSize->m_data[2]; z_00 = z_00 + A) {
    for (y_01 = R; (int)y_01 < iVar9; y_01 = y_01 + A) {
      CVar8 = ~y_01 + local_ec ^ z_00;
      CVar5 = local_f0;
      for (x_00 = R; (int)x_00 < iVar4; x_00 = x_00 + A) {
        local_128._0_4_ = y_01 ^ z_00 ^ x_00;
        local_128._4_4_ = y_01 ^ z_00 ^ CVar5;
        local_128._8_4_ = CVar8 ^ x_00;
        local_128._12_4_ = CVar8 ^ CVar5;
        if ((char)local_100 == '\0') {
          tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&local_c8);
          tcu::operator*((tcu *)&local_d8,local_e4,&local_c8);
          tcu::operator+((tcu *)&local_110,local_e8,&local_d8);
          tcu::PixelBufferAccess::setPixel(&local_90,&local_110,x_00,y_01,z_00);
        }
        else {
          tcu::PixelBufferAccess::setPixel(&local_90,(IVec4 *)local_128,x_00,y_01,z_00);
        }
        iVar4 = local_f8->m_data[0];
        CVar5 = CVar5 - A;
      }
      iVar9 = local_f8->m_data[1];
      imageSize = local_f8;
    }
  }
  bVar3 = ::vk::isFloatFormat(local_128._20_4_);
  if ((local_128._16_4_ != format) && (bVar3)) {
    local_d8.m_data._0_8_ = ::vk::mapVkFormat(format);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_b8,(TextureFormat *)&local_d8,imageSize,
               local_90.super_ConstPixelBufferAccess.m_data);
    for (uVar6 = 0; imageSize = local_f8, format = local_128._20_4_,
        (int)uVar6 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[2];
        uVar6 = (ulong)((int)uVar6 + 1)) {
      local_100 = uVar6;
      for (iVar4 = 0; iVar4 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[1];
          iVar4 = iVar4 + 1) {
        for (iVar9 = 0; iVar9 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[0];
            iVar9 = iVar9 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_128,(int)&local_b8,iVar9,iVar4);
          tcu::Vector<float,_4>::Vector(&local_110,(Vector<float,_4> *)local_128);
          for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
            if (local_b8.super_ConstPixelBufferAccess.m_format.type == HALF_FLOAT) {
              tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                        ((Float<unsigned_short,_5,_10,_15,_3U> *)&local_c8,
                         *(float *)(local_128 + lVar7 * 4));
              bVar10 = (local_c8.m_data[0]._0_2_ & 0x7c00) == 0;
              bVar11 = (local_c8.m_data[0]._0_2_ & 0x3ff) != 0;
              bVar3 = (local_c8.m_data[0]._0_2_ & 0x7c00) == 0x7c00;
              if ((local_c8.m_data[0]._0_2_ & 0x7fff) == 0x7c00) goto LAB_006d5bcd;
LAB_006d5bc7:
              if ((bool)(bVar11 & (bVar10 | bVar3))) goto LAB_006d5bcd;
            }
            else {
              uVar1 = *(uint *)(local_128 + lVar7 * 4);
              bVar10 = (uVar1 & 0x7f800000) == 0;
              bVar11 = (uVar1 & 0x7fffff) != 0;
              bVar3 = (uVar1 & 0x7f800000) == 0x7f800000;
              if ((uVar1 & 0x7fffffff) != 0x7f800000) goto LAB_006d5bc7;
LAB_006d5bcd:
              local_110.m_data[lVar7] = 0.0;
            }
          }
          bVar3 = tcu::Vector<float,_4>::operator!=(&local_110,(Vector<float,_4> *)local_128);
          uVar6 = local_100;
          if (bVar3) {
            tcu::PixelBufferAccess::setPixel(&local_b8,&local_110,iVar9,iVar4,(int)local_100);
          }
        }
      }
    }
  }
  uVar2 = local_128._16_4_;
  bVar3 = ::vk::isSnormFormat(format);
  if ((uVar2 != format) && (bVar3)) {
    local_d8.m_data._0_8_ = ::vk::mapVkFormat(format);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_68,(TextureFormat *)&local_d8,imageSize,
               local_90.super_ConstPixelBufferAccess.m_data);
    for (iVar4 = 0; iVar4 < local_68.super_ConstPixelBufferAccess.m_size.m_data[2];
        iVar4 = iVar4 + 1) {
      for (iVar9 = 0; iVar9 < local_68.super_ConstPixelBufferAccess.m_size.m_data[1];
          iVar9 = iVar9 + 1) {
        for (y_00 = 0; y_00 < local_68.super_ConstPixelBufferAccess.m_size.m_data[0];
            y_00 = y_00 + 1) {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_128,(int)&local_68,y_00,iVar9);
          tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_110,(Vector<int,_4> *)local_128);
          for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
            if (*(int *)(local_128 + lVar7 * 4) == -0x80) {
              local_110.m_data[lVar7] = -NAN;
            }
          }
          bVar3 = tcu::Vector<int,_4>::operator!=
                            ((Vector<int,_4> *)&local_110,(Vector<int,_4> *)local_128);
          if (bVar3) {
            tcu::PixelBufferAccess::setPixel(&local_68,(IVec4 *)&local_110,y_00,iVar9,iVar4);
          }
        }
      }
    }
  }
  return local_e0;
}

Assistant:

tcu::TextureLevel generateReferenceImage (const tcu::IVec3& imageSize, const VkFormat imageFormat, const VkFormat readFormat)
{
	// Generate a reference image data using the storage format

	tcu::TextureLevel reference(mapVkFormat(imageFormat), imageSize.x(), imageSize.y(), imageSize.z());
	const tcu::PixelBufferAccess access = reference.getAccess();

	const float storeColorScale = computeStoreColorScale(imageFormat, imageSize);
	const float storeColorBias = computeStoreColorBias(imageFormat);

	const bool intFormat = isIntegerFormat(imageFormat);
	const int xMax = imageSize.x() - 1;
	const int yMax = imageSize.y() - 1;

	for (int z = 0; z < imageSize.z(); ++z)
	for (int y = 0; y < imageSize.y(); ++y)
	for (int x = 0; x < imageSize.x(); ++x)
	{
		const tcu::IVec4 color(x^y^z, (xMax - x)^y^z, x^(yMax - y)^z, (xMax - x)^(yMax - y)^z);

		if (intFormat)
			access.setPixel(color, x, y, z);
		else
			access.setPixel(color.asFloat()*storeColorScale + storeColorBias, x, y, z);
	}

	// If the image is to be accessed as a float texture, get rid of invalid values

	if (isFloatFormat(readFormat) && imageFormat != readFormat)
		replaceBadFloatReinterpretValues(tcu::PixelBufferAccess(mapVkFormat(readFormat), imageSize, access.getDataPtr()));
	if (isSnormFormat(readFormat) && imageFormat != readFormat)
		replaceSnormReinterpretValues(tcu::PixelBufferAccess(mapVkFormat(readFormat), imageSize, access.getDataPtr()));

	return reference;
}